

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord_rep_btree_navigator.cc
# Opt level: O3

Position __thiscall
absl::lts_20250127::cord_internal::CordRepBtreeNavigator::Skip(CordRepBtreeNavigator *this,size_t n)

{
  byte bVar1;
  byte bVar2;
  bool bVar3;
  CordRepBtree *pCVar4;
  CordRepBtree *pCVar5;
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  CordRepBtree *pCVar9;
  ulong uVar10;
  int iVar11;
  ulong uVar12;
  Position PVar13;
  
  bVar1 = this->index_[0];
  uVar7 = (ulong)bVar1;
  pCVar9 = this->node_[0];
  if (bVar1 < (pCVar9->super_CordRep).storage[1]) {
LAB_003338f1:
    __assert_fail("index >= begin()",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/strings/internal/cord_rep_btree.h"
                  ,0x268,"CordRep *absl::cord_internal::CordRepBtree::Edge(size_t) const");
  }
  if ((pCVar9->super_CordRep).storage[2] <= bVar1) {
LAB_003338d2:
    __assert_fail("index < end()",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/strings/internal/cord_rep_btree.h"
                  ,0x269,"CordRep *absl::cord_internal::CordRepBtree::Edge(size_t) const");
  }
  pCVar5 = (CordRepBtree *)pCVar9->edges_[uVar7];
  uVar8 = (pCVar5->super_CordRep).length;
  if (uVar8 <= n) {
    pCVar4 = (CordRepBtree *)0x0;
    uVar12 = 0;
    do {
      n = n - uVar8;
      uVar7 = uVar7 + 1;
      uVar8 = (ulong)(pCVar9->super_CordRep).storage[2];
      if (uVar7 == uVar8) {
        iVar11 = (int)uVar12;
        iVar6 = this->height_;
        if (this->height_ < iVar11) {
          iVar6 = iVar11;
        }
        uVar10 = (long)iVar11;
        do {
          if ((long)iVar6 == uVar10) goto LAB_003337d1;
          uVar12 = uVar10 + 1;
          pCVar9 = this->node_[uVar10 + 1];
          uVar7 = (ulong)this->index_[uVar10 + 1] + 1;
          uVar8 = (ulong)(pCVar9->super_CordRep).storage[2];
          uVar10 = uVar12;
        } while (uVar7 == uVar8);
      }
      if (uVar7 < (pCVar9->super_CordRep).storage[1]) goto LAB_003338f1;
      if (uVar8 <= uVar7) goto LAB_003338d2;
      pCVar5 = (CordRepBtree *)pCVar9->edges_[uVar7];
      uVar8 = (pCVar5->super_CordRep).length;
    } while (uVar8 <= n);
    if (0 < (int)uVar12) {
      pCVar9 = pCVar5;
      uVar8 = uVar12 & 0xffffffff;
      do {
        if ((pCVar9->super_CordRep).tag != '\x03') {
          __assert_fail("IsBtree()",
                        "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/strings/internal/cord_rep_btree.h"
                        ,599,"CordRepBtree *absl::cord_internal::CordRep::btree()");
        }
        this->index_[uVar8] = (uint8_t)uVar7;
        this->node_[uVar8 - 1] = pCVar9;
        bVar1 = (pCVar9->super_CordRep).storage[1];
        uVar7 = (ulong)bVar1;
        bVar2 = (pCVar9->super_CordRep).storage[2];
        if (bVar2 <= bVar1) goto LAB_003338d2;
        pCVar5 = (CordRepBtree *)pCVar9->edges_[uVar7];
        uVar12 = (pCVar5->super_CordRep).length;
        if (uVar12 <= n) {
          do {
            if ((ulong)bVar2 - 1 == uVar7) {
              __assert_fail("index != node->end()",
                            "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/strings/internal/cord_rep_btree_navigator.cc"
                            ,100,
                            "CordRepBtreeNavigator::Position absl::cord_internal::CordRepBtreeNavigator::Skip(size_t)"
                           );
            }
            n = n - uVar12;
            pCVar5 = (CordRepBtree *)pCVar9->edges_[uVar7 + 1];
            uVar12 = (pCVar5->super_CordRep).length;
            uVar7 = uVar7 + 1;
          } while (uVar12 <= n);
        }
        bVar3 = 1 < (long)uVar8;
        pCVar9 = pCVar5;
        uVar8 = uVar8 - 1;
      } while (bVar3);
    }
  }
  this->index_[0] = (uint8_t)uVar7;
  pCVar4 = pCVar5;
LAB_003337d1:
  PVar13.offset = n;
  PVar13.edge = &pCVar4->super_CordRep;
  return PVar13;
}

Assistant:

CordRepBtreeNavigator::Position CordRepBtreeNavigator::Skip(size_t n) {
  int height = 0;
  size_t index = index_[0];
  CordRepBtree* node = node_[0];
  CordRep* edge = node->Edge(index);

  // Overall logic: Find an edge of at least the length we need to skip.
  // We consume all edges which are smaller (i.e., must be 100% skipped).
  // If we exhausted all edges on the current level, we move one level
  // up the tree, and repeat until we either find the edge, or until we hit
  // the top of the tree meaning the skip exceeds tree->length.
  while (n >= edge->length) {
    n -= edge->length;
    while (++index == node->end()) {
      if (++height > height_) return {nullptr, n};
      node = node_[height];
      index = index_[height];
    }
    edge = node->Edge(index);
  }

  // If we moved up the tree, descend down to the leaf level, consuming all
  // edges that must be skipped.
  while (height > 0) {
    node = edge->btree();
    index_[height] = static_cast<uint8_t>(index);
    node_[--height] = node;
    index = node->begin();
    edge = node->Edge(index);
    while (n >= edge->length) {
      n -= edge->length;
      ++index;
      assert(index != node->end());
      edge = node->Edge(index);
    }
  }
  index_[0] = static_cast<uint8_t>(index);
  return {edge, n};
}